

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O2

uint64_t readStringLength(istream *stream)

{
  long in_RAX;
  ulong uVar1;
  long lStack_28;
  uchar c;
  
  uVar1 = 0;
  lStack_28 = in_RAX;
  do {
    std::istream::read((char *)stream,(long)&c);
    uVar1 = (ulong)(c & 0x7f) | uVar1 << 7;
  } while (lStack_28 < 0);
  return uVar1;
}

Assistant:

std::uint64_t readStringLength(std::istream & stream)
{
  std::uint64_t value = 0;
  unsigned char c;
  do {
    stream.read(reinterpret_cast<char *>(&c), 1);
    value <<= 7;
    value |= (c & 0x7F);
  } while (c & 128);
  return value;
}